

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example008_miller_rabin_prime.cpp
# Opt level: O0

bool math::wide_integer::example008_miller_rabin_prime(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined4 local_10;
  bool result_known_primes_is_ok;
  bool result_prime_run_is_ok;
  uint i;
  bool result_is_ok;
  
  bVar2 = true;
  for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
    bVar3 = local_example008_miller_rabin_prime::example008_miller_rabin_prime_run();
    bVar1 = false;
    if (bVar3) {
      bVar1 = bVar2;
    }
    bVar2 = bVar1;
  }
  bVar3 = local_example008_miller_rabin_prime::example008_miller_rabin_prime_check_known_primes();
  bVar1 = false;
  if (bVar3) {
    bVar1 = bVar2;
  }
  return bVar1;
}

Assistant:

auto ::math::wide_integer::example008_miller_rabin_prime() -> bool
#endif
{
  auto result_is_ok = true;

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
  #if !defined(UINTWIDE_T_REDUCE_TEST_DEPTH)
             i < static_cast<unsigned>(UINT8_C(8));
  #else
             i < static_cast<unsigned>(UINT8_C(1));
  #endif
           ++i)
  {
    const auto result_prime_run_is_ok =
      local_example008_miller_rabin_prime::example008_miller_rabin_prime_run();
  
    result_is_ok = (result_prime_run_is_ok && result_is_ok);
  }

  {
    const auto result_known_primes_is_ok =
      local_example008_miller_rabin_prime::example008_miller_rabin_prime_check_known_primes();

    result_is_ok = (result_known_primes_is_ok && result_is_ok);
  }

  return result_is_ok;
}